

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to1_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  float *k00_1;
  int j_1;
  int k_1;
  int p_1;
  float *g00_1;
  Mat k0;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffa20;
  size_t in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa30;
  int _c;
  undefined8 in_stack_fffffffffffffa38;
  Mat *in_stack_fffffffffffffa40;
  int local_524;
  int local_520;
  int local_51c;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  Allocator *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb0c;
  int in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  Mat *in_stack_fffffffffffffb18;
  undefined4 uVar1;
  undefined4 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4a0;
  undefined4 local_494;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined4 local_468;
  long *local_460;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined8 local_440;
  void *local_438;
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  long local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  undefined4 *local_3d8;
  int local_3d0;
  void *local_3c0;
  int *local_3b8;
  long local_3b0;
  long *local_3a0;
  int local_394;
  int local_390;
  long local_380;
  int local_374;
  int local_368;
  int local_364;
  long *local_360;
  undefined8 *local_350;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_328;
  void **local_318;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  undefined8 *local_2a0;
  undefined8 *local_280;
  undefined1 local_275;
  int local_274;
  undefined8 *local_268;
  undefined1 local_245;
  int local_244;
  void **local_240;
  undefined8 *local_238;
  undefined1 local_215;
  int local_214;
  void **local_210;
  undefined8 *local_208;
  undefined1 local_1e5;
  int local_1e4;
  undefined8 *local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  int local_12c;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  undefined4 *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  void *local_d0;
  undefined8 *local_b8;
  void *local_98;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 *local_60;
  undefined4 local_54;
  undefined4 local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
  local_374 = in_R8D * in_R9D;
  local_368 = in_ECX;
  local_364 = in_EDX;
  local_360 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
               in_stack_fffffffffffffb0c,in_stack_fffffffffffffb00);
  Mat::create(in_stack_fffffffffffffa40,(int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
              (int)in_stack_fffffffffffffa38,_c,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20)
  ;
  for (local_3d0 = 0; local_3d0 + 7 < local_368; local_3d0 = local_3d0 + 8) {
    local_1e4 = local_3d0 / 8;
    local_1d8 = &local_420;
    local_f4 = *(int *)((long)local_360 + 0x2c);
    local_f8 = (int)local_360[6];
    local_fc = *(undefined4 *)((long)local_360 + 0x34);
    local_108 = (undefined4 *)(*local_360 + local_360[8] * (long)local_1e4 * local_360[2]);
    local_110 = local_360[2];
    local_114 = (undefined4)local_360[3];
    local_120 = local_360[4];
    local_f0 = &local_420;
    local_8 = (long)local_f4 * (long)local_f8 * local_110;
    local_1b0 = &local_420;
    local_350 = &local_420;
    local_c = 0x10;
    local_1e5 = 1;
    local_420 = 0;
    local_410 = 0;
    local_408 = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    local_3f0 = 0;
    local_3ec = 0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_418 = 0;
    local_3d8 = local_108;
    for (local_424 = 0; local_424 + 7 < local_364; local_424 = local_424 + 8) {
      for (local_428 = 0; local_428 < local_374; local_428 = local_428 + 1) {
        for (local_42c = 0; local_42c < 8; local_42c = local_42c + 1) {
          for (local_430 = 0; local_430 < 8; local_430 = local_430 + 1) {
            local_214 = local_3d0 + local_430;
            local_208 = &local_480;
            local_210 = &local_3c0;
            local_d0 = (void *)((long)local_3c0 + local_380 * local_214 * local_3b0);
            local_b8 = &local_480;
            local_460 = local_3a0;
            local_18 = (long)local_394 * (long)local_390 * local_3b0;
            local_1c = 0x10;
            local_215 = 1;
            local_12c = local_424 + local_42c;
            local_128 = &local_480;
            local_438 = (void *)((long)local_d0 + (long)local_394 * (long)local_12c * local_3b0);
            local_340 = &local_480;
            local_480 = 0;
            local_470 = 0;
            local_468 = 0;
            local_458 = 0;
            local_454 = 0;
            local_450 = 0;
            local_44c = 0;
            local_448 = 0;
            local_440 = 0;
            local_478 = 0;
            *local_3d8 = *(undefined4 *)((long)local_438 + (long)local_428 * 4);
            local_3d8 = local_3d8 + 1;
            local_2a0 = local_340;
          }
        }
      }
    }
    local_280 = local_350;
    local_400 = local_120;
  }
  for (; local_3d0 < local_368; local_3d0 = local_3d0 + 1) {
    local_238 = &local_4c8;
    local_240 = &local_3c0;
    local_98 = (void *)((long)local_3c0 + local_380 * local_3d0 * local_3b0);
    local_80 = &local_4c8;
    local_28 = (long)local_394 * (long)local_390 * local_3b0;
    local_274 = local_3d0 / 8 + local_3d0 % 8;
    local_268 = &local_518;
    local_4c = *(int *)((long)local_360 + 0x2c);
    local_50 = (undefined4)local_360[6];
    local_54 = *(undefined4 *)((long)local_360 + 0x34);
    local_60 = (undefined4 *)(*local_360 + local_360[8] * (long)local_274 * local_360[2]);
    local_68 = local_360[2];
    local_6c = (undefined4)local_360[3];
    local_78 = local_360[4];
    local_48 = &local_518;
    uVar1 = 1;
    local_38 = (long)local_4c * (long)(int)in_stack_fffffffffffffb18 * local_68;
    local_1b8 = &local_518;
    local_338 = &local_518;
    local_518 = 0;
    local_508 = 0;
    uVar1 = 0;
    local_510 = 0;
    local_4d0 = local_60;
    for (local_51c = 0; local_51c + 7 < local_364; local_51c = local_51c + 8) {
      for (local_520 = 0; local_520 < local_374; local_520 = local_520 + 1) {
        for (local_524 = 0; local_524 < 8; local_524 = local_524 + 1) {
          local_1a4 = local_51c + local_524;
          local_1a0 = &local_4c8;
          *local_4d0 = *(undefined4 *)
                        ((long)local_98 +
                        (long)local_520 * 4 + (long)local_394 * (long)local_1a4 * local_3b0);
          local_4d0 = local_4d0 + 1;
        }
      }
    }
    local_328 = &local_4c8;
    local_2c = 0x10;
    local_3c = 0x10;
    local_244 = local_3d0;
    local_245 = 1;
    local_275 = 1;
    local_4c8 = 0;
    local_4a0 = 0;
    local_494 = 0;
    local_488 = 0;
    local_4c0 = 0;
    local_2d0 = local_328;
    local_2b0 = local_338;
  }
  local_318 = &local_3c0;
  if (local_3b8 != (int *)0x0) {
    local_2f4 = 0xffffffff;
    LOCK();
    local_2f8 = *local_3b8;
    *local_3b8 = *local_3b8 + -1;
    UNLOCK();
    if (local_2f8 == 1) {
      local_2f0 = local_318;
      if (local_3a0 == (long *)0x0) {
        if (local_3c0 != (void *)0x0) {
          free(local_3c0);
        }
      }
      else {
        (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to1_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = pb-pa-maxk-inch/pa-outch/pb
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * 8 * maxk, inch / 8, outch / 8 + outch % 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + q % 8);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 8; j++)
                {
                    const float* k00 = k0.row(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}